

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int integrityCheckResultRow(Vdbe *v,int regResult)

{
  int iVar1;
  int addr;
  int regResult_local;
  Vdbe *v_local;
  
  sqlite3VdbeAddOp2(v,0x43,regResult,1);
  iVar1 = sqlite3VdbeCurrentAddr(v);
  iVar1 = sqlite3VdbeAddOp3(v,0x2e,1,iVar1 + 2,1);
  sqlite3VdbeAddOp2(v,0x37,0,0);
  return iVar1;
}

Assistant:

static int integrityCheckResultRow(Vdbe *v, int regResult){
  int addr;
  sqlite3VdbeAddOp2(v, OP_ResultRow, regResult, 1);
  addr = sqlite3VdbeAddOp3(v, OP_IfPos, 1, sqlite3VdbeCurrentAddr(v)+2, 1);
  VdbeCoverage(v);
  sqlite3VdbeAddOp2(v, OP_Halt, 0, 0);
  return addr;
}